

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
::~UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
           *this)

{
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
  *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__UnaryBuiltinVecFunc_0025b490;
  if (this->m_child != (Expression *)0x0) {
    (*this->m_child->_vptr_Expression[1])();
  }
  ValueStorage<64>::~ValueStorage(&this->m_value);
  ValueRange::~ValueRange(&this->m_inValueRange);
  std::__cxx11::string::~string((string *)&this->m_function);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::~UnaryBuiltinVecFunc (void)
{
	delete m_child;
}